

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_ce22::BlockCopy<unsigned_char>::Run
          (BlockCopy<unsigned_char> *this,istream *input_stream)

{
  uint write_size;
  int iVar1;
  bool bVar2;
  char *__nptr;
  pointer puVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  uint write_size_00;
  uint uVar7;
  istream *piVar8;
  int *piVar9;
  undefined8 uVar10;
  ostream *poVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  string word;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pad_data;
  uchar local_ca;
  char *local_b8;
  long local_b0;
  char local_a8 [16];
  istream *local_98;
  ulong local_90;
  pointer local_88;
  pointer local_80;
  ulong local_78;
  long local_70;
  char *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  uVar13 = this->input_end_number_ - this->input_start_number_;
  write_size = this->output_start_number_;
  write_size_00 = (~uVar13 - write_size) + this->output_block_length_;
  uVar7 = write_size_00;
  if ((int)write_size_00 < (int)write_size) {
    uVar7 = write_size;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,(long)(int)uVar7,&this->pad_value_,(allocator_type *)&local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_60,(long)this->input_block_length_,(allocator_type *)&local_b8);
  if (this->is_ascii_ == false) {
    while (bVar5 = sptk::ReadStream<unsigned_char>
                             (false,0,0,this->input_block_length_,&local_60,input_stream,(int *)0x0)
          , bVar5) {
      if ((((0 < (int)write_size) &&
           (bVar6 = sptk::WriteStream<unsigned_char>
                              (0,write_size,&local_48,(ostream *)&std::cout,(int *)0x0), !bVar6)) ||
          (bVar6 = sptk::WriteStream<unsigned_char>
                             (this->input_start_number_,uVar13 + 1,&local_60,(ostream *)&std::cout,
                              (int *)0x0), !bVar6)) ||
         ((0 < (int)write_size_00 &&
          (bVar6 = sptk::WriteStream<unsigned_char>
                             (0,write_size_00,&local_48,(ostream *)&std::cout,(int *)0x0), !bVar6)))
         ) break;
    }
    bVar5 = !bVar5;
  }
  else {
    local_88 = local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_70 = (long)(int)write_size_00;
    local_90 = 0;
    local_80 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_98 = input_stream;
    local_78 = (ulong)write_size;
    while (bVar5 = true, (local_90 & 1) == 0) {
      if (0 < this->input_block_length_) {
        lVar14 = 0;
        do {
          local_b8 = local_a8;
          local_b0 = 0;
          local_a8[0] = '\0';
          piVar8 = std::operator>>(input_stream,(string *)&local_b8);
          __nptr = local_b8;
          if (local_b0 == 0) {
            bVar2 = true;
            local_90 = CONCAT71((int7)((ulong)piVar8 >> 8),1);
            bVar6 = false;
          }
          else {
            bVar6 = true;
            bVar2 = false;
            if ((this->input_start_number_ <= lVar14) && (lVar14 <= this->input_end_number_)) {
              piVar9 = __errno_location();
              iVar1 = *piVar9;
              *piVar9 = 0;
              strtold(__nptr,&local_68);
              if (local_68 == __nptr) {
                uVar10 = std::__throw_invalid_argument("stold");
LAB_0010758d:
                if (local_b8 != local_a8) {
                  operator_delete(local_b8);
                }
                if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_60.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_48.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                _Unwind_Resume(uVar10);
              }
              if (*piVar9 == 0) {
                *piVar9 = iVar1;
              }
              else if (*piVar9 == 0x22) {
                uVar10 = std::__throw_out_of_range("stold");
                goto LAB_0010758d;
              }
              local_ca = (uchar)(short)ROUND(in_ST0);
              local_88[lVar14] = local_ca;
              input_stream = local_98;
              in_ST0 = in_ST1;
              in_ST1 = in_ST2;
              in_ST2 = in_ST3;
              in_ST3 = in_ST4;
              in_ST4 = in_ST5;
              in_ST5 = in_ST6;
              in_ST6 = in_ST7;
              bVar2 = false;
            }
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8);
          }
          if (!bVar6) {
            if (!bVar2) {
              bVar5 = true;
              if (bVar2) {
                bVar5 = false;
              }
              goto LAB_0010753e;
            }
            break;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < this->input_block_length_);
      }
      uVar4 = local_78;
      puVar3 = local_80;
      if ((local_90 & 1) != 0) break;
      if (0 < (int)local_78) {
        uVar12 = 0;
        do {
          local_b8 = (char *)CONCAT71(local_b8._1_7_,puVar3[uVar12]);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)&local_b8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
      }
      if (this->input_start_number_ <= this->input_end_number_) {
        lVar14 = (long)this->input_start_number_ + -1;
        do {
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18))
               = 0x13;
          local_b8 = (char *)CONCAT71(local_b8._1_7_,local_88[lVar14 + 1]);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)&local_b8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          lVar14 = lVar14 + 1;
        } while (lVar14 < this->input_end_number_);
      }
      if (0 < (int)write_size_00) {
        lVar14 = 0;
        do {
          local_b8 = (char *)CONCAT71(local_b8._1_7_,puVar3[lVar14]);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)&local_b8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          lVar14 = lVar14 + 1;
        } while (lVar14 < local_70);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
    }
  }
LAB_0010753e:
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    const int copy_length(input_end_number_ - input_start_number_ + 1);
    const int left_pad_length(output_start_number_);
    const int right_pad_length(output_block_length_ - output_start_number_ -
                               copy_length);

    std::vector<T> pad_data(std::max(left_pad_length, right_pad_length),
                            pad_value_);
    std::vector<T> input_data(input_block_length_);

    if (is_ascii_) {
      T* pads(&(pad_data[0]));
      T* inputs(&(input_data[0]));
      bool halt(false);
      while (!halt) {
        // Read data.
        for (int i(0); i < input_block_length_; ++i) {
          std::string word;
          *input_stream >> word;
          if (word.empty()) {
            halt = true;
            break;
          }
          if (input_start_number_ <= i && i <= input_end_number_) {
            try {
              inputs[i] = static_cast<T>(std::stold(word));
            } catch (std::invalid_argument&) {
              return false;
            }
          }
        }
        if (halt) break;

        // Write data.
        for (int i(0); i < left_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        for (int i(input_start_number_); i <= input_end_number_; ++i) {
          std::cout << std::setprecision(
                           std::numeric_limits<long double>::digits10 + 1)
                    << inputs[i] << " ";
        }
        for (int i(0); i < right_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        std::cout << std::endl;
      }
    } else {
      while (sptk::ReadStream(false, 0, 0, input_block_length_, &input_data,
                              input_stream, NULL)) {
        if (0 < left_pad_length &&
            !sptk::WriteStream(0, left_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
        if (!sptk::WriteStream(input_start_number_, copy_length, input_data,
                               &std::cout, NULL)) {
          return false;
        }
        if (0 < right_pad_length &&
            !sptk::WriteStream(0, right_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
      }
    }

    return true;
  }